

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

_Bool golf_script_load(golf_script_t *script,char *path,char *data,int data_len)

{
  uint *value;
  gs_parser_t *parser;
  int *piVar1;
  int *capacity;
  vec_gs_env_t *data_00;
  byte bVar2;
  char cVar3;
  gs_env_t **ppgVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  gs_token_t *pgVar9;
  char *pcVar10;
  map_base_t *m;
  gs_stmt_t *stmt;
  uint uVar11;
  long lVar12;
  long lVar13;
  gs_token_type gVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  gs_token_t token;
  int local_a0;
  char *local_88;
  char *local_68;
  gs_val_t local_60;
  long local_48;
  char *local_40;
  char **local_38;
  
  iVar6 = vec_expand_((char **)&_gs_store,&_gs_store.scripts.length,&_gs_store.scripts.capacity,8,
                      _gs_store.scripts.alloc_category);
  if (iVar6 == 0) {
    lVar12 = (long)_gs_store.scripts.length;
    _gs_store.scripts.length = _gs_store.scripts.length + 1;
    _gs_store.scripts.data[lVar12] = script;
  }
  iVar20 = 0;
  snprintf(script->path,0x400,"%s",path);
  local_38 = &script->error;
  parser = &script->parser;
  (script->parser).tokens.length = 0;
  (script->parser).tokens.capacity = 0;
  (script->parser).tokens.alloc_category = (char *)0x0;
  script->error = (char *)0x0;
  (script->parser).tokens.data = (gs_token_t *)0x0;
  (script->parser).tokens.alloc_category = "script/parser";
  (script->parser).cur_token = 0;
  (script->parser).error = false;
  (script->parser).allocated_memory.data = (void **)0x0;
  (script->parser).allocated_memory.length = 0;
  (script->parser).allocated_memory.capacity = 0;
  (script->parser).allocated_memory.alloc_category = "script/parser";
  piVar1 = &(script->parser).tokens.length;
  capacity = &(script->parser).tokens.capacity;
  local_88 = data + 1;
  local_a0 = 1;
  iVar6 = 1;
  local_68 = local_88;
  local_40 = local_88;
LAB_00138bdf:
  lVar12 = (long)iVar20;
  pcVar18 = data + lVar12;
  bVar2 = data[lVar12];
  if (bVar2 == 0x2f) {
    if (pcVar18[1] == '/') {
      for (; (*pcVar18 != '\0' && (*pcVar18 != '\n')); pcVar18 = pcVar18 + 1) {
        iVar20 = iVar20 + 1;
      }
      goto LAB_00138bdf;
    }
LAB_00138c3b:
    if ((bVar2 != 0x5f) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
      if ((byte)(bVar2 - 0x30) < 10) {
        iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                            (script->parser).tokens.alloc_category);
        if (iVar7 == 0) {
          pgVar9 = (parser->tokens).data;
          iVar7 = *piVar1;
          *piVar1 = iVar7 + 1;
          cVar3 = *pcVar18;
          local_68 = (char *)(ulong)(cVar3 == '-');
          fVar21 = 0.0;
          fVar17 = 0.0;
          bVar5 = false;
          fVar22 = 10.0;
          do {
            uVar11 = (uint)(byte)pcVar18[(long)local_68];
            if ((byte)(pcVar18[(long)local_68] - 0x30U) < 10) {
              if (bVar5) {
                fVar21 = fVar21 + (float)(int)(uVar11 - 0x30) / fVar22;
                fVar22 = fVar22 * 10.0;
              }
              else {
                fVar17 = (float)(uVar11 + (int)fVar17 * 10 + -0x30);
              }
            }
            else {
              if (uVar11 != 0x2e) goto LAB_00138eb2;
              bVar5 = true;
            }
            local_68 = local_68 + 1;
          } while( true );
        }
        goto LAB_00138f01;
      }
      uVar11 = bVar2 - 0x22;
      if (uVar11 < 0x3c) {
        if ((0xa0000001e003fc0U >> ((ulong)uVar11 & 0x3f) & 1) == 0) {
          if ((ulong)uVar11 != 0) goto LAB_00138f96;
          iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                              (script->parser).tokens.alloc_category);
          if (iVar7 == 0) {
            pgVar9 = (parser->tokens).data + *piVar1;
            *piVar1 = *piVar1 + 1;
            uVar11 = 1;
            lVar15 = 0x100000000;
            for (uVar16 = 1; (data[uVar16 + lVar12] != '\0' && (data[uVar16 + lVar12] != '\"'));
                uVar16 = uVar16 + 1) {
              lVar15 = lVar15 + 0x100000000;
              uVar11 = uVar11 + 1;
            }
            pcVar10 = (char *)golf_alloc_tracked(uVar16 & 0xffffffff,"script/parser");
            if (1 < uVar16) {
              if ((int)uVar11 < 3) {
                uVar11 = 2;
              }
              lVar13 = 0;
              do {
                pcVar10[lVar13] = local_40[lVar13 + lVar12];
                lVar13 = lVar13 + 1;
              } while ((ulong)uVar11 - 1 != lVar13);
            }
            pcVar10[(lVar15 >> 0x20) + -1] = '\0';
            local_88 = (char *)(ulong)((int)uVar16 + (uint)(pcVar18[lVar15 >> 0x20] == '\"'));
            pgVar9->type = GS_TOKEN_STRING;
            pgVar9->line = local_a0;
            pgVar9->col = iVar6;
            (pgVar9->field_3).symbol = pcVar10;
          }
          iVar20 = iVar20 + (int)local_88;
          iVar6 = iVar6 + (int)local_88;
          goto LAB_00138bdf;
        }
      }
      else {
LAB_00138f96:
        if ((bVar2 != 0x7b) && (bVar2 != 0x7d)) {
          local_60.type = GS_VAL_FLOAT;
          local_60._4_4_ = local_a0;
          local_60.field_2.int_val = iVar6;
          local_60.field_2.field10[8] = bVar2;
          gs_parser_error(parser,0x244c45);
          goto LAB_0013908f;
        }
      }
      iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,
                          (script->parser).tokens.alloc_category);
      if (iVar7 == 0) {
        pgVar9 = (parser->tokens).data;
        iVar7 = *piVar1;
        *piVar1 = iVar7 + 1;
        cVar3 = *pcVar18;
        pgVar9[iVar7].type = GS_TOKEN_CHAR;
        pgVar9[iVar7].line = local_a0;
        pgVar9[iVar7].col = iVar6;
        pgVar9[iVar7].field_3.c = cVar3;
      }
      iVar6 = iVar6 + 1;
      iVar20 = iVar20 + 1;
      goto LAB_00138bdf;
    }
    iVar7 = vec_expand_((char **)parser,piVar1,capacity,0x18,(script->parser).tokens.alloc_category)
    ;
    lVar15 = 0;
    if (iVar7 == 0) {
      pgVar9 = (parser->tokens).data;
      local_48 = (long)*piVar1;
      *piVar1 = *piVar1 + 1;
      lVar13 = -0x100000000;
      lVar15 = -1;
      uVar11 = 0;
      do {
        do {
          uVar8 = uVar11;
          lVar19 = lVar15;
          bVar2 = data[lVar19 + lVar12 + 1];
          lVar13 = lVar13 + 0x100000000;
          lVar15 = lVar19 + 1;
          uVar11 = uVar8 + 1;
        } while (bVar2 == 0x5f);
      } while (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a));
      pcVar18 = (char *)golf_alloc_tracked((ulong)((int)lVar19 + 2),"script/parser");
      if (0 < lVar15) {
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
        uVar16 = 0;
        do {
          pcVar18[uVar16] = data[uVar16 + lVar12];
          uVar16 = uVar16 + 1;
        } while (uVar8 != uVar16);
      }
      pgVar9 = pgVar9 + local_48;
      pcVar18[lVar13 >> 0x20] = '\0';
      pgVar9->type = GS_TOKEN_SYMBOL;
      pgVar9->line = local_a0;
      pgVar9->col = iVar6;
      (pgVar9->field_3).symbol = pcVar18;
    }
    iVar20 = iVar20 + (int)lVar15;
    iVar6 = iVar6 + (int)lVar15;
    goto LAB_00138bdf;
  }
  if (9 < bVar2) {
    if (bVar2 == 10) {
      local_a0 = local_a0 + 1;
      iVar20 = iVar20 + 1;
      iVar6 = 1;
    }
    else {
      if ((bVar2 != 0x20) && (bVar2 != 0xd)) goto LAB_00138c3b;
LAB_00138c26:
      iVar6 = iVar6 + 1;
      iVar20 = iVar20 + 1;
    }
    goto LAB_00138bdf;
  }
  if (bVar2 != 0) {
    if (bVar2 == 9) goto LAB_00138c26;
    goto LAB_00138c3b;
  }
  iVar20 = vec_expand_((char **)parser,piVar1,capacity,0x18,(script->parser).tokens.alloc_category);
  if (iVar20 == 0) {
    pgVar9 = (parser->tokens).data;
    iVar20 = *piVar1;
    *piVar1 = iVar20 + 1;
    pgVar9[iVar20].type = GS_TOKEN_EOF;
    pgVar9[iVar20].line = local_a0;
    pgVar9[iVar20].col = iVar6;
  }
LAB_0013908f:
  if ((script->parser).error == true) {
LAB_00139098:
    script->error = (script->parser).error_string;
  }
  else {
    m = (map_base_t *)golf_alloc_tracked(0x38,"script/eval");
    m[1].buckets = (map_node_t **)0x0;
    m[1].nbuckets = 0;
    m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)0x0;
    m[2].nbuckets = 0;
    m[2].nnodes = 0;
    m->buckets = (map_node_t **)0x0;
    m->nbuckets = 0;
    m->nnodes = 0;
    m[3].buckets = (map_node_t **)"script/eval";
    value = &m[1].nbuckets;
    m[1].nbuckets = 3;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined4 *)&m[2].buckets = 0x40490fdb;
    map_set_(m,"PI",value,0x18,"script/eval");
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 1;
    map_set_(m,"true",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 1;
    *(undefined1 *)&m[1].nnodes = 0;
    *(undefined1 *)&m[2].buckets = 0;
    map_set_(m,"false",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_print;
    map_set_(m,"print",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V2;
    map_set_(m,"V2",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_V3;
    map_set_(m,"V3",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec2_bezier4;
    map_set_(m,"vec2_bezier4",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_distance;
    map_set_(m,"vec3_distance",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_length;
    map_set_(m,"vec3_length",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_vec3_normalize;
    map_set_(m,"vec3_normalize",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_cos;
    map_set_(m,"cos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sin;
    map_set_(m,"sin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_acos;
    map_set_(m,"acos",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_asin;
    map_set_(m,"asin",value,0x18,(char *)m[3].buckets);
    m[1].nbuckets = 9;
    *(undefined1 *)&m[1].nnodes = 0;
    m[2].buckets = (map_node_t **)gs_c_fn_sqrt;
    map_set_(m,"sqrt",value,0x18,(char *)m[3].buckets);
    data_00 = &(script->eval).env;
    (script->eval).env.data = (gs_env_t **)0x0;
    (script->eval).env.length = 0;
    (script->eval).env.capacity = 0;
    (script->eval).env.alloc_category = "script/eval";
    piVar1 = &(script->eval).env.length;
    iVar6 = vec_expand_((char **)data_00,piVar1,&(script->eval).env.capacity,8,"script/eval");
    if (iVar6 == 0) {
      ppgVar4 = data_00->data;
      iVar6 = *piVar1;
      *piVar1 = iVar6 + 1;
      ppgVar4[iVar6] = (gs_env_t *)m;
    }
    (script->eval).allocated_strings.data = (void **)0x0;
    (script->eval).allocated_strings.length = 0;
    (script->eval).allocated_strings.capacity = 0;
    (script->eval).allocated_strings.alloc_category = (char *)0x0;
    (script->eval).allocated_strings.alloc_category = "script/eval";
    (script->eval).allocated_lists.data = (void **)0x0;
    (script->eval).allocated_lists.length = 0;
    (script->eval).allocated_lists.capacity = 0;
    (script->eval).allocated_lists.alloc_category = "script/eval";
    if ((script->parser).tokens.data[(script->parser).cur_token].type != GS_TOKEN_EOF) {
      do {
        stmt = gs_parse_stmt(parser);
        if ((script->parser).error == true) goto LAB_00139098;
        gs_eval_stmt(&local_60,&script->eval,stmt);
        if (local_60.type == GS_VAL_ERROR) {
          *local_38 = (char *)CONCAT44(local_60.field_2.vec2_val.y,local_60.field_2.int_val);
          return true;
        }
      } while ((script->parser).tokens.data[(script->parser).cur_token].type != GS_TOKEN_EOF);
    }
  }
  return true;
LAB_00138eb2:
  if (bVar5) {
    fVar21 = fVar21 + (float)(int)fVar17;
    if (cVar3 == '-') {
      fVar21 = -fVar21;
    }
    gVar14 = GS_TOKEN_FLOAT;
  }
  else {
    fVar21 = (float)-(int)fVar17;
    if (cVar3 != '-') {
      fVar21 = fVar17;
    }
    gVar14 = GS_TOKEN_INT;
  }
  pgVar9 = pgVar9 + iVar7;
  pgVar9->type = gVar14;
  pgVar9->line = local_a0;
  pgVar9->col = iVar6;
  (pgVar9->field_3).float_val = fVar21;
LAB_00138f01:
  iVar20 = iVar20 + (int)local_68;
  iVar6 = iVar6 + (int)local_68;
  goto LAB_00138bdf;
}

Assistant:

bool golf_script_load(golf_script_t *script, const char *path, const char *data, int data_len) {
    GOLF_UNUSED(data_len);

    vec_push(&_gs_store.scripts, script);

    snprintf(script->path, GOLF_FILE_MAX_PATH, "%s", path);
    script->error = NULL;
    vec_init(&script->parser.tokens, "script/parser");
    script->parser.cur_token = 0;
    script->parser.error = false;
    vec_init(&script->parser.allocated_memory, "script/parser");

    gs_tokenize(&script->parser, data);
    if (script->parser.error) {
        script->error = script->parser.error_string;
        return true;
    }
    if (false) {
        gs_debug_print_tokens(&script->parser.tokens);
    }

    gs_env_t *global_env = golf_alloc_tracked(sizeof(gs_env_t), "script/eval");
    map_init(&global_env->val_map, "script/eval");
    map_set(&global_env->val_map, "PI", gs_val_float(MF_PI));
    map_set(&global_env->val_map, "true", gs_val_bool(true));
    map_set(&global_env->val_map, "false", gs_val_bool(false));
    map_set(&global_env->val_map, "print", gs_val_c_fn(gs_c_fn_print));
    map_set(&global_env->val_map, "V2", gs_val_c_fn(gs_c_fn_V2));
    map_set(&global_env->val_map, "V3", gs_val_c_fn(gs_c_fn_V3));
    map_set(&global_env->val_map, "vec2_bezier4", gs_val_c_fn(gs_c_fn_vec2_bezier4));
    map_set(&global_env->val_map, "vec3_distance", gs_val_c_fn(gs_c_fn_vec3_distance));
    map_set(&global_env->val_map, "vec3_length", gs_val_c_fn(gs_c_fn_vec3_length));
    map_set(&global_env->val_map, "vec3_normalize", gs_val_c_fn(gs_c_fn_vec3_normalize));
    map_set(&global_env->val_map, "cos", gs_val_c_fn(gs_c_fn_cos));
    map_set(&global_env->val_map, "sin", gs_val_c_fn(gs_c_fn_sin));
    map_set(&global_env->val_map, "acos", gs_val_c_fn(gs_c_fn_acos));
    map_set(&global_env->val_map, "asin", gs_val_c_fn(gs_c_fn_asin));
    map_set(&global_env->val_map, "sqrt", gs_val_c_fn(gs_c_fn_sqrt));
    //map_set(&global_env->val_map, "terrain_model_add_point", gs_val_c_fn(gs_c_fn_terrain_model_add_point));
    //map_set(&global_env->val_map, "terrain_model_add_face", gs_val_c_fn(gs_c_fn_terrain_model_add_face));

    vec_init(&script->eval.env, "script/eval");
    vec_push(&script->eval.env, global_env);
    vec_init(&script->eval.allocated_strings, "script/eval");
    vec_init(&script->eval.allocated_lists, "script/eval");

    while (!gs_peek_eof(&script->parser)) {
        gs_stmt_t *stmt = gs_parse_stmt(&script->parser);
        if (script->parser.error) {
            script->error = script->parser.error_string;
            return true;
        }

        gs_val_t val = gs_eval_stmt(&script->eval, stmt);
        if (val.type == GS_VAL_ERROR) {
            script->error = val.error_val;
            return true;
        }
        if (false) {
            gs_debug_print_stmt(stmt, 0);
            gs_debug_print_val(val);
            printf("\n");
        }
    }

    return true;
}